

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

int m_select_code_option(aec_stream *strm)

{
  int iVar1;
  internal_state *state_00;
  internal_state *piVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  bool bVar6;
  uint64_t fs;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  byte *dst;
  int iVar14;
  uint32_t uVar15;
  size_t i;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  internal_state *state;
  
  state_00 = strm->state;
  iVar10 = state_00->id_len;
  uVar13 = strm->block_size;
  uVar12 = 0xffffffff;
  if (1 < iVar10) {
    iVar14 = uVar13 - state_00->ref;
    iVar1 = state_00->k;
    bVar18 = false;
    iVar5 = iVar1;
    bVar6 = iVar1 == 0;
    iVar9 = iVar1;
    uVar8 = 0xffffffffffffffff;
    do {
      do {
        while( true ) {
          while( true ) {
            bVar4 = bVar6;
            iVar3 = iVar5;
            uVar7 = 0;
            for (uVar16 = 0; uVar13 != uVar16; uVar16 = uVar16 + 1) {
              uVar7 = uVar7 + (state_00->block[uVar16] >> ((byte)iVar3 & 0x1f));
            }
            uVar16 = (long)((iVar3 + 1) * iVar14) + uVar7;
            if (uVar16 < uVar8) break;
            bVar18 = true;
            iVar5 = iVar1 + -1;
            bVar6 = true;
            if (bVar4) goto LAB_00101927;
          }
          if (uVar8 != 0xffffffffffffffff) {
            bVar4 = true;
          }
          uVar8 = uVar16;
          iVar9 = iVar3;
          bVar6 = bVar4;
          if (!bVar18) break;
          if ((iVar3 == 0) || ((ulong)(long)iVar14 <= uVar7)) goto LAB_00101927;
          bVar18 = true;
          iVar5 = iVar3 + -1;
        }
      } while (((ulong)(long)iVar14 <= uVar7) &&
              (bVar18 = false, iVar5 = iVar3 + 1, iVar3 < state_00->kmax));
      bVar18 = true;
      iVar5 = iVar1 + -1;
      bVar6 = true;
    } while (!bVar4);
LAB_00101927:
    uVar12 = (uint)uVar8;
    state_00->k = iVar9;
  }
  uVar11 = 0xffffffff;
  uVar8 = 1;
  uVar7 = 0;
  do {
    if (uVar13 <= uVar7) {
      uVar15 = state_00->uncomp_len;
      uVar11 = (uint)uVar8;
      break;
    }
    uVar16 = (ulong)state_00->block[uVar7];
    uVar17 = (ulong)state_00->block[uVar7 + 1];
    uVar8 = uVar8 + uVar17 + ((uVar16 + uVar17 + 1) * (uVar17 + uVar16) >> 1) + 1;
    uVar15 = state_00->uncomp_len;
    uVar7 = uVar7 + 2;
  } while (uVar8 <= uVar15);
  if (uVar12 < uVar15) {
    if (uVar11 <= uVar12) {
LAB_001019c8:
      m_encode_se(strm);
      return 1;
    }
    uVar13 = state_00->k;
    emit(state_00,uVar13 + 1,iVar10);
    if (state_00->ref == 0) {
      uVar8 = 0;
    }
    else {
      emit(state_00,state_00->ref_sample,strm->bits_per_sample);
      uVar8 = (ulong)state_00->ref;
    }
    piVar2 = strm->state;
    dst = piVar2->cds;
    uVar7 = (ulong)*dst << 0x38;
    uVar12 = 7 - piVar2->bits;
    for (; uVar8 < strm->block_size; uVar8 = uVar8 + 1) {
      for (iVar10 = (piVar2->block[uVar8] >> ((byte)uVar13 & 0x1f)) + uVar12 + -0x3e;
          uVar12 = iVar10 + 0x3f, 0x3f < uVar12; iVar10 = iVar10 + -0x40) {
        copy64(dst,uVar7);
        dst = piVar2->cds + 8;
        piVar2->cds = dst;
        uVar7 = 0;
      }
      uVar7 = uVar7 | 1L << ((ulong)(byte)-(char)iVar10 & 0x3f);
    }
    copy64(dst,uVar7);
    piVar2->cds = piVar2->cds + (uVar12 >> 3);
    piVar2->bits = ~uVar12 & 7;
    if (uVar13 == 0) goto LAB_00101aab;
    iVar10 = state_00->ref;
  }
  else {
    if (uVar11 < uVar15) goto LAB_001019c8;
    emit(state_00,~(-1 << ((byte)iVar10 & 0x1f)),iVar10);
    if (state_00->ref != 0) {
      *state_00->block = state_00->ref_sample;
    }
    uVar13 = strm->bits_per_sample;
    iVar10 = 0;
  }
  emitblock(strm,uVar13,iVar10);
LAB_00101aab:
  m_flush_block(strm);
  return 1;
}

Assistant:

static int m_select_code_option(struct aec_stream *strm)
{
    /**
       Decide which code option to use.
    */

    uint32_t split_len;
    uint32_t se_len;
    struct internal_state *state = strm->state;

    if (state->id_len > 1)
        split_len = assess_splitting_option(strm);
    else
        split_len = UINT32_MAX;
    se_len = assess_se_option(strm);

    if (split_len < state->uncomp_len) {
        if (split_len < se_len)
            return m_encode_splitting(strm);
        else
            return m_encode_se(strm);
    } else {
        if (state->uncomp_len <= se_len)
            return m_encode_uncomp(strm);
        else
            return m_encode_se(strm);
    }
}